

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

int string_get_hex(JSString *p,int k,int n)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  uint uVar5;
  
  if (n < 1) {
    return 0;
  }
  lVar3 = (long)k;
  iVar2 = n + 1;
  uVar1 = 0;
  while( true ) {
    if ((int)*(undefined8 *)&p->field_0x4 < 0) {
      uVar4 = (uint)*(ushort *)((long)&p[1].header.ref_count + lVar3 * 2);
    }
    else {
      uVar4 = (uint)*(byte *)((long)&p[1].header.ref_count + lVar3);
    }
    uVar5 = uVar4 - 0x30;
    if (9 < uVar5) {
      if (uVar4 - 0x41 < 6) {
        uVar5 = uVar4 - 0x37;
      }
      else {
        uVar5 = uVar4 - 0x57;
        if (5 < uVar4 - 0x61) {
          uVar5 = 0xffffffff;
        }
      }
    }
    if ((int)uVar5 < 0) break;
    lVar3 = lVar3 + 1;
    uVar1 = uVar1 << 4 | uVar5;
    iVar2 = iVar2 + -1;
    if (iVar2 < 2) {
      return uVar1;
    }
  }
  return -1;
}

Assistant:

static int string_get_hex(JSString *p, int k, int n) {
    int c = 0, h;
    while (n-- > 0) {
        if ((h = from_hex(string_get(p, k++))) < 0)
            return -1;
        c = (c << 4) | h;
    }
    return c;
}